

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jchuff.c
# Opt level: O1

boolean encode_mcu_gather(j_compress_ptr cinfo,JBLOCKROW *MCU_data)

{
  ushort uVar1;
  jpeg_entropy_encoder *pjVar2;
  JBLOCKROW paJVar3;
  _func_boolean_j_compress_ptr_JBLOCKROW_ptr *p_Var4;
  _func_void_j_compress_ptr *p_Var5;
  jpeg_error_mgr *pjVar6;
  bool bVar7;
  uint uVar8;
  ushort uVar9;
  long lVar10;
  uint uVar11;
  int iVar12;
  ulong uVar13;
  uint uVar14;
  long lVar15;
  long lVar16;
  int iVar17;
  
  pjVar2 = cinfo->entropy;
  if (cinfo->restart_interval != 0) {
    if (*(int *)&pjVar2[2].encode_mcu == 0) {
      if (0 < cinfo->comps_in_scan) {
        lVar10 = 0;
        do {
          *(undefined4 *)((long)&pjVar2[1].encode_mcu + lVar10 * 4 + 4) = 0;
          lVar10 = lVar10 + 1;
        } while (lVar10 < cinfo->comps_in_scan);
      }
      *(uint *)&pjVar2[2].encode_mcu = cinfo->restart_interval;
    }
    *(int *)&pjVar2[2].encode_mcu = *(int *)&pjVar2[2].encode_mcu + -1;
  }
  if (0 < cinfo->blocks_in_MCU) {
    lVar10 = 0;
    do {
      lVar16 = (long)cinfo->MCU_membership[lVar10];
      paJVar3 = MCU_data[lVar10];
      uVar14 = 0;
      uVar11 = (int)(*paJVar3)[0] - *(int *)((long)&pjVar2[1].encode_mcu + lVar16 * 4 + 4);
      if (uVar11 != 0) {
        uVar8 = -uVar11;
        if (0 < (int)uVar11) {
          uVar8 = uVar11;
        }
        uVar14 = 0;
        uVar13 = (ulong)uVar8;
        do {
          uVar14 = uVar14 + 1;
          uVar13 = uVar13 >> 1;
          bVar7 = 1 < uVar8;
          uVar8 = (uint)uVar13;
        } while (bVar7);
      }
      p_Var4 = (&pjVar2[5].encode_mcu)[cinfo->cur_comp_info[lVar16]->dc_tbl_no];
      p_Var5 = (&pjVar2[6].finish_pass)[cinfo->cur_comp_info[lVar16]->ac_tbl_no];
      if (0xb < uVar14) {
        pjVar6 = cinfo->err;
        pjVar6->msg_code = 6;
        (*pjVar6->error_exit)((j_common_ptr)cinfo);
      }
      *(long *)(p_Var4 + (ulong)uVar14 * 8) = *(long *)(p_Var4 + (ulong)uVar14 * 8) + 1;
      iVar17 = 0;
      lVar15 = 1;
      do {
        uVar1 = (*paJVar3)[jpeg_natural_order[lVar15]];
        if (uVar1 == 0) {
          iVar17 = iVar17 + 1;
        }
        else {
          if (0xf < iVar17) {
            iVar12 = 0x1f;
            if (iVar17 < 0x1f) {
              iVar12 = iVar17;
            }
            uVar11 = (iVar17 - iVar12) + 0xf;
            iVar17 = (iVar17 - (uVar11 & 0xfffffff0)) + -0x10;
            *(ulong *)(p_Var5 + 0x780) = (ulong)(uVar11 >> 4) + *(long *)(p_Var5 + 0x780) + 1;
          }
          uVar9 = -uVar1;
          if (0 < (short)uVar1) {
            uVar9 = uVar1;
          }
          uVar11 = 1;
          if (1 < uVar9) {
            uVar13 = (ulong)uVar9;
            uVar14 = (uint)uVar9;
            do {
              uVar13 = uVar13 >> 1;
              uVar11 = uVar11 + 1;
              bVar7 = 3 < uVar14;
              uVar14 = (uint)uVar13;
            } while (bVar7);
          }
          if (10 < uVar11) {
            pjVar6 = cinfo->err;
            pjVar6->msg_code = 6;
            (*pjVar6->error_exit)((j_common_ptr)cinfo);
          }
          *(long *)(p_Var5 + (long)(int)(uVar11 + iVar17 * 0x10) * 8) =
               *(long *)(p_Var5 + (long)(int)(uVar11 + iVar17 * 0x10) * 8) + 1;
          iVar17 = 0;
        }
        lVar15 = lVar15 + 1;
      } while (lVar15 != 0x40);
      if (0 < iVar17) {
        *(long *)p_Var5 = *(long *)p_Var5 + 1;
      }
      *(int *)((long)&pjVar2[1].encode_mcu + lVar16 * 4 + 4) = (int)(*MCU_data[lVar10])[0];
      lVar10 = lVar10 + 1;
    } while (lVar10 < cinfo->blocks_in_MCU);
  }
  return 1;
}

Assistant:

METHODDEF(boolean)
encode_mcu_gather(j_compress_ptr cinfo, JBLOCKROW *MCU_data)
{
  huff_entropy_ptr entropy = (huff_entropy_ptr)cinfo->entropy;
  int blkn, ci;
  jpeg_component_info *compptr;

  /* Take care of restart intervals if needed */
  if (cinfo->restart_interval) {
    if (entropy->restarts_to_go == 0) {
      /* Re-initialize DC predictions to 0 */
      for (ci = 0; ci < cinfo->comps_in_scan; ci++)
        entropy->saved.last_dc_val[ci] = 0;
      /* Update restart state */
      entropy->restarts_to_go = cinfo->restart_interval;
    }
    entropy->restarts_to_go--;
  }

  for (blkn = 0; blkn < cinfo->blocks_in_MCU; blkn++) {
    ci = cinfo->MCU_membership[blkn];
    compptr = cinfo->cur_comp_info[ci];
    htest_one_block(cinfo, MCU_data[blkn][0], entropy->saved.last_dc_val[ci],
                    entropy->dc_count_ptrs[compptr->dc_tbl_no],
                    entropy->ac_count_ptrs[compptr->ac_tbl_no]);
    entropy->saved.last_dc_val[ci] = MCU_data[blkn][0][0];
  }

  return TRUE;
}